

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

bool __thiscall
SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Prepend
          (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *this,
          ArenaAllocator *allocator,BasicBlock **data)

{
  Type_conflict pSVar1;
  SListNode<BasicBlock*,Memory::ArenaAllocator> *pSVar2;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *alloc;
  SListNode<BasicBlock*,Memory::ArenaAllocator> *this_00;
  Type_conflict *ppSVar3;
  TrackAllocData local_58;
  SListNode<BasicBlock*,Memory::ArenaAllocator> *local_30;
  Node *newNode;
  BasicBlock **data_local;
  ArenaAllocator *allocator_local;
  SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *this_local;
  
  newNode = (Node *)data;
  data_local = (BasicBlock **)allocator;
  allocator_local = (ArenaAllocator *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&SListNode<BasicBlock*,Memory::ArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
             ,0x13b);
  alloc = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                    (&allocator->
                      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                     &local_58);
  this_00 = (SListNode<BasicBlock*,Memory::ArenaAllocator> *)
            new<Memory::ArenaAllocator>(0x10,(ArenaAllocator *)alloc,0x3f67b0);
  SListNode<BasicBlock*,Memory::ArenaAllocator>::SListNode<BasicBlock*>
            (this_00,(BasicBlock **)newNode);
  if (this_00 != (SListNode<BasicBlock*,Memory::ArenaAllocator> *)0x0) {
    local_30 = this_00;
    ppSVar3 = SListNodeBase<Memory::ArenaAllocator>::Next
                        (&this->super_SListNodeBase<Memory::ArenaAllocator>);
    pSVar1 = *ppSVar3;
    ppSVar3 = SListNodeBase<Memory::ArenaAllocator>::Next
                        ((SListNodeBase<Memory::ArenaAllocator> *)local_30);
    pSVar2 = local_30;
    *ppSVar3 = pSVar1;
    ppSVar3 = SListNodeBase<Memory::ArenaAllocator>::Next
                        (&this->super_SListNodeBase<Memory::ArenaAllocator>);
    *ppSVar3 = (Type_conflict)pSVar2;
    RealCount::IncrementCount(&this->super_RealCount);
  }
  return this_00 != (SListNode<BasicBlock*,Memory::ArenaAllocator> *)0x0;
}

Assistant:

bool Prepend(TAllocator * allocator, TData const& data)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, data);
        if (newNode)
        {
            newNode->Next() = this->Next();
            this->Next() = newNode;
            this->IncrementCount();
            return true;
        }
        return false;
    }